

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_000001ac;
  size_t in_stack_000001b0;
  uchar *in_stack_000001b8;
  uint *in_stack_000001c0;
  uint *in_stack_000001c8;
  uchar **in_stack_000001d0;
  uint in_stack_000001e0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uchar **in_stack_ffffffffffffffc8;
  
  *in_RDI = 0;
  *in_RDX = 0;
  *in_RSI = 0;
  uVar1 = lodepng_load_file(in_stack_ffffffffffffffc8,
                            (size_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (uVar1 == 0) {
    uVar1 = lodepng_decode_memory
                      (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                       in_stack_000001b0,in_stack_000001ac,in_stack_000001e0);
  }
  lodepng_free((void *)0x169214);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
  LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  size_t buffersize;
  unsigned error;
  /* safe output values in case error happens */
  *out = 0;
  *w = *h = 0;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if (!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}